

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parg.hh
# Opt level: O2

string * __thiscall OB::Parg::help_abi_cxx11_(string *__return_storage_ptr__,Parg *this)

{
  string *psVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t;
  string *psVar3;
  stringstream local_380 [8];
  stringstream ss;
  ostream local_370 [376];
  stringstream local_1f8 [8];
  stringstream out;
  ostream local_1e8 [376];
  string local_70 [32];
  string *local_50;
  string *local_48;
  string *local_40;
  info_pair *e;
  
  local_48 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1f8);
  e = (info_pair *)this;
  if ((this->description_)._M_string_length != 0) {
    poVar2 = std::operator<<(local_1e8,(string *)&this->name_);
    poVar2 = std::operator<<(poVar2,":");
    std::operator<<(poVar2,"\n");
    std::__cxx11::stringstream::stringstream(local_380);
    poVar2 = std::operator<<(local_1e8,"  ");
    poVar2 = std::operator<<(poVar2,(string *)e[2].title.field_2._M_local_buf);
    std::operator<<(poVar2,"\n");
    std::__cxx11::stringbuf::str();
    poVar2 = std::operator<<(local_1e8,local_70);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string(local_70);
    std::__cxx11::stringstream::~stringstream(local_380);
  }
  if (e[1].text.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    poVar2 = std::operator<<(local_1e8,"Usage: ");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,(string *)
                                    &e[1].text.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish);
    std::operator<<(poVar2,"\n");
  }
  if (e[3].title._M_dataplus._M_p != (pointer)0x0) {
    poVar2 = std::operator<<(local_1e8,"Flags: ");
    poVar2 = std::operator<<(poVar2,"\n");
    std::operator<<(poVar2,(string *)
                           &e[2].text.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  if (e[3].text.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    poVar2 = std::operator<<(local_1e8,"\nOptions: ");
    poVar2 = std::operator<<(poVar2,"\n");
    std::operator<<(poVar2,(string *)(e[3].title.field_2._M_local_buf + 8));
  }
  psVar3 = (string *)e[4].title._M_string_length;
  local_50 = (string *)e[4].title.field_2._M_allocated_capacity;
  if (psVar3 != local_50) {
    while (local_40 = psVar3, psVar3 != local_50) {
      poVar2 = std::operator<<(local_1e8,"\n");
      poVar2 = std::operator<<(poVar2,local_40);
      poVar2 = std::operator<<(poVar2,":");
      std::operator<<(poVar2,"\n");
      psVar1 = *(string **)(local_40 + 0x28);
      for (psVar3 = *(string **)(local_40 + 0x20); psVar3 != psVar1; psVar3 = psVar3 + 0x20) {
        poVar2 = std::operator<<(local_1e8,"  ");
        poVar2 = std::operator<<(poVar2,psVar3);
        std::operator<<(poVar2,"\n");
      }
      psVar3 = local_40 + 0x38;
    }
  }
  if (e[4].text.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    poVar2 = std::operator<<(local_1e8,"\nAuthor: ");
    std::operator<<(poVar2,"\n");
    std::__cxx11::stringstream::stringstream(local_380);
    poVar2 = std::operator<<(local_370,"  ");
    poVar2 = std::operator<<(poVar2,(string *)&e[4].text);
    std::operator<<(poVar2,"\n");
    std::__cxx11::stringbuf::str();
    std::operator<<(local_1e8,local_70);
    std::__cxx11::string::~string(local_70);
    std::__cxx11::stringstream::~stringstream(local_380);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1f8);
  return local_48;
}

Assistant:

std::string help() const
  {
    std::stringstream out;
    if (! description_.empty())
    {
      out << name_ << ":" << "\n";
      std::stringstream ss;
      out << "  " << description_ << "\n";
      out << ss.str() << "\n";
    }

    if (! usage_.empty())
    {
      out << "Usage: " << "\n"
        << usage_ << "\n";
    }

    if (! modes_.empty())
    {
      out << "Flags: " << "\n"
        << modes_;
    }

    if (! options_.empty())
    {
      out << "\nOptions: " << "\n"
        << options_;
    }

    if (! info_.empty())
    {
      for (auto const& e : info_)
      {
        out << "\n" << e.title << ":" << "\n";

        for (auto const& t : e.text)
        {
          out << "  " << t << "\n";
        }
      }
    }

    if (! author_.empty())
    {
      out << "\nAuthor: " << "\n";
      std::stringstream ss;
      ss << "  " << author_ << "\n";
      out << ss.str();
    }

    return out.str();
  }